

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O0

GLuint make_shader(GLenum type,char *text)

{
  char *pcVar1;
  GLchar local_2028 [8];
  char info_log [8192];
  int local_20;
  GLsizei log_length;
  GLint shader_ok;
  GLuint shader;
  char *text_local;
  GLenum type_local;
  
  _shader_ok = text;
  text_local._4_4_ = type;
  log_length = (*glad_glCreateShader)(type);
  if (log_length != 0) {
    (*glad_glShaderSource)(log_length,1,(GLchar **)&shader_ok,(GLint *)0x0);
    (*glad_glCompileShader)(log_length);
    (*glad_glGetShaderiv)(log_length,0x8b81,&local_20);
    if (local_20 != 1) {
      pcVar1 = "vertex";
      if (text_local._4_4_ == 0x8b30) {
        pcVar1 = "fragment";
      }
      fprintf(_stderr,"ERROR: Failed to compile %s shader\n",pcVar1);
      (*glad_glGetShaderInfoLog)(log_length,0x2000,(GLsizei *)(info_log + 0x1ffc),local_2028);
      fprintf(_stderr,"ERROR: \n%s\n\n",local_2028);
      (*glad_glDeleteShader)(log_length);
      log_length = 0;
    }
  }
  return log_length;
}

Assistant:

static GLuint make_shader(GLenum type, const char* text)
{
    GLuint shader;
    GLint shader_ok;
    GLsizei log_length;
    char info_log[8192];

    shader = glCreateShader(type);
    if (shader != 0)
    {
        glShaderSource(shader, 1, (const GLchar**)&text, NULL);
        glCompileShader(shader);
        glGetShaderiv(shader, GL_COMPILE_STATUS, &shader_ok);
        if (shader_ok != GL_TRUE)
        {
            fprintf(stderr, "ERROR: Failed to compile %s shader\n", (type == GL_FRAGMENT_SHADER) ? "fragment" : "vertex" );
            glGetShaderInfoLog(shader, 8192, &log_length,info_log);
            fprintf(stderr, "ERROR: \n%s\n\n", info_log);
            glDeleteShader(shader);
            shader = 0;
        }
    }
    return shader;
}